

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlReporter::report_query(XmlReporter *this,QueryData *in)

{
  bool bVar1;
  long in_RSI;
  XmlReporter *in_RDI;
  uint i_1;
  uint i;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  *curr_1;
  iterator __end3_1;
  iterator __begin3_1;
  reporterMap *__range3_1;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  *curr;
  iterator __end3;
  iterator __begin3;
  reporterMap *__range3;
  map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
  *in_stack_fffffffffffffb18;
  allocator *paVar2;
  String *in_stack_fffffffffffffb20;
  XmlWriter *this_00;
  string *in_stack_fffffffffffffb28;
  allocator *name;
  ScopedElement *in_stack_fffffffffffffb30;
  allocator *this_01;
  string *in_stack_fffffffffffffb40;
  XmlWriter *in_stack_fffffffffffffb48;
  XmlWriter *in_stack_fffffffffffffb50;
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [47];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [47];
  undefined1 local_309 [41];
  string local_2e0 [40];
  uint local_2b8;
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [47];
  allocator local_259;
  string local_258 [32];
  uint local_238;
  allocator local_231;
  string local_230 [32];
  char *local_210;
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [40];
  uint local_160;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [40];
  reference local_e0;
  _Self local_d8;
  _Self local_d0;
  reporterMap *local_c8;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [40];
  reference local_30;
  _Self local_28;
  _Self local_20;
  reporterMap *local_18;
  long local_10;
  
  local_10 = in_RSI;
  (*(in_RDI->super_IReporter)._vptr_IReporter[1])();
  if ((in_RDI->opt->list_reporters & 1U) == 0) {
    if (((in_RDI->opt->count & 1U) == 0) && ((in_RDI->opt->list_test_cases & 1U) == 0)) {
      if ((in_RDI->opt->list_test_suites & 1U) != 0) {
        for (local_2b8 = 0; local_2b8 < *(uint *)(local_10 + 0x10); local_2b8 = local_2b8 + 1) {
          in_stack_fffffffffffffb50 = &in_RDI->xml;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2e0,"TestSuite",(allocator *)(local_309 + 0x28));
          XmlWriter::scopedElement(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
          in_stack_fffffffffffffb48 = (XmlWriter *)local_309;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_309 + 1),"name",(allocator *)in_stack_fffffffffffffb48);
          (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                    (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                     (char **)in_stack_fffffffffffffb20);
          std::__cxx11::string::~string((string *)(local_309 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_309);
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb20);
          std::__cxx11::string::~string(local_2e0);
          std::allocator<char>::~allocator((allocator<char> *)(local_309 + 0x28));
        }
        paVar2 = &local_339;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_338,"OverallResultsTestCases",paVar2);
        XmlWriter::scopedElement(in_stack_fffffffffffffb48,(string *)paVar2);
        this_01 = &local_361;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_360,"unskipped",this_01);
        XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                  ((ScopedElement *)this_01,in_stack_fffffffffffffb28,
                   (uint *)in_stack_fffffffffffffb20);
        std::__cxx11::string::~string(local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb20);
        std::__cxx11::string::~string(local_338);
        std::allocator<char>::~allocator((allocator<char> *)&local_339);
        this_00 = &in_RDI->xml;
        name = &local_391;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_390,"OverallResultsTestSuites",name);
        XmlWriter::scopedElement(in_stack_fffffffffffffb48,(string *)paVar2);
        paVar2 = &local_3b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"unskipped",paVar2);
        XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                  ((ScopedElement *)this_01,(string *)name,(uint *)this_00);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_00);
        std::__cxx11::string::~string(local_390);
        std::allocator<char>::~allocator((allocator<char> *)&local_391);
      }
    }
    else {
      for (local_160 = 0; local_160 < *(uint *)(local_10 + 0x10); local_160 = local_160 + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_188,"TestCase",&local_189);
        XmlWriter::scopedElement(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b0,"name",&local_1b1);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                   (char **)in_stack_fffffffffffffb20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d8,"testsuite",&local_1d9);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                   (char **)in_stack_fffffffffffffb20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_200,"filename",&local_201);
        String::c_str((String *)0x11b23b);
        local_210 = skipPathFromFilename((char *)in_stack_fffffffffffffb28);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                   (char **)in_stack_fffffffffffffb20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_230,"line",&local_231);
        local_238 = line(in_RDI,*(uint *)(*(long *)(*(long *)(local_10 + 8) + (ulong)local_160 * 8)
                                         + 0x18));
        XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                   (uint *)in_stack_fffffffffffffb20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_258,"skipped",&local_259);
        XmlWriter::ScopedElement::writeAttribute<bool>
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                   (bool *)in_stack_fffffffffffffb20);
        std::__cxx11::string::~string(local_258);
        std::allocator<char>::~allocator((allocator<char> *)&local_259);
        std::__cxx11::string::~string(local_230);
        std::allocator<char>::~allocator((allocator<char> *)&local_231);
        std::__cxx11::string::~string(local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
        std::__cxx11::string::~string(local_1d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
        std::__cxx11::string::~string(local_1b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb20);
        std::__cxx11::string::~string(local_188);
        std::allocator<char>::~allocator((allocator<char> *)&local_189);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,"OverallResultsTestCases",&local_289);
      XmlWriter::scopedElement(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,"unskipped",&local_2b1);
      XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                 (uint *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
    }
  }
  else {
    local_18 = getListeners();
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
         ::begin(in_stack_fffffffffffffb18);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
         ::end(in_stack_fffffffffffffb18);
    while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
      local_30 = std::
                 _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                              *)0x11ab08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"Listener",&local_59);
      XmlWriter::scopedElement(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"priority",&local_91);
      XmlWriter::ScopedElement::writeAttribute<int>
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                 (int *)in_stack_fffffffffffffb20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"name",&local_b9);
      XmlWriter::ScopedElement::writeAttribute<doctest::String>
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                    *)in_stack_fffffffffffffb20);
    }
    local_c8 = getReporters();
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
         ::begin(in_stack_fffffffffffffb18);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
         ::end(in_stack_fffffffffffffb18);
    while (bVar1 = std::operator!=(&local_d0,&local_d8), bVar1) {
      local_e0 = std::
                 _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                              *)0x11ade0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"Reporter",&local_109);
      XmlWriter::scopedElement(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"priority",&local_131);
      XmlWriter::ScopedElement::writeAttribute<int>
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                 (int *)in_stack_fffffffffffffb20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"name",&local_159);
      XmlWriter::ScopedElement::writeAttribute<doctest::String>
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
                    *)in_stack_fffffffffffffb20);
    }
  }
  XmlWriter::endElement(in_stack_fffffffffffffb50);
  return;
}

Assistant:

void report_query(const QueryData& in) override {
            test_run_start();
            if(opt.list_reporters) {
                for(auto& curr : getListeners())
                    xml.scopedElement("Listener")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
                for(auto& curr : getReporters())
                    xml.scopedElement("Reporter")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
            } else if(opt.count || opt.list_test_cases) {
                for(unsigned i = 0; i < in.num_data; ++i) {
                    xml.scopedElement("TestCase").writeAttribute("name", in.data[i]->m_name)
                        .writeAttribute("testsuite", in.data[i]->m_test_suite)
                        .writeAttribute("filename", skipPathFromFilename(in.data[i]->m_file.c_str()))
                        .writeAttribute("line", line(in.data[i]->m_line))
                        .writeAttribute("skipped", in.data[i]->m_skip);
                }
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
            } else if(opt.list_test_suites) {
                for(unsigned i = 0; i < in.num_data; ++i)
                    xml.scopedElement("TestSuite").writeAttribute("name", in.data[i]->m_test_suite);
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
                xml.scopedElement("OverallResultsTestSuites")
                        .writeAttribute("unskipped", in.run_stats->numTestSuitesPassingFilters);
            }
            xml.endElement();
        }